

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O0

void __thiscall pg::NPPSolver::atronsubgamedw(NPPSolver *this)

{
  deque<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  bool bVar1;
  uint uVar2;
  reference ppdVar3;
  reference puVar4;
  reference ppbVar5;
  reference pplVar6;
  int iVar7;
  bool local_519;
  bool local_509;
  bool local_4f1;
  bool local_4e1;
  undefined1 local_4c8 [8];
  iterator qiter;
  iterator qend;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *heads;
  NPPSolver *this_local;
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  undefined1 local_448 [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [24];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [28];
  int from_1;
  int *curedge_3;
  reference local_3a8;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *entries_1;
  bitset *supgame_3;
  NPPSolver *local_390;
  uint local_384;
  uintqueue *local_380;
  uint local_374;
  uintqueue *local_370;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [24];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [28];
  int from;
  int *curedge;
  reference local_2a8;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *entries;
  bitset *supgame;
  NPPSolver *local_290;
  uint local_284;
  uintqueue *local_280;
  uint local_274;
  uintqueue *local_270;
  undefined1 local_268 [24];
  bitset *exits;
  undefined1 local_240 [16];
  undefined1 local_230 [28];
  int to;
  int *curedge_1;
  bitset *supgame_1;
  NPPSolver *local_200;
  char local_1f5;
  uint local_1f4;
  uintqueue *local_1f0;
  uintqueue *local_1e8;
  uintqueue *local_1e0;
  undefined1 local_1d8 [24];
  bitset *exits_1;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [28];
  int to_1;
  int *curedge_2;
  bitset *supgame_2;
  NPPSolver *local_170;
  char local_165;
  uint local_164;
  uintqueue *local_160;
  uintqueue *local_158;
  uintqueue *local_150;
  undefined1 local_148 [24];
  bitset *exits_2;
  undefined1 local_120 [16];
  undefined1 local_110 [28];
  int to_2;
  int *curedge_4;
  bitset *supgame_4;
  NPPSolver *local_e0;
  char local_d5;
  uint local_d4;
  uintqueue *local_d0;
  uintqueue *local_c8;
  uintqueue *local_c0;
  undefined1 local_b8 [24];
  bitset *exits_3;
  undefined1 local_90 [16];
  undefined1 local_80 [28];
  int to_3;
  int *curedge_5;
  bitset *supgame_5;
  NPPSolver *local_50;
  char local_45;
  uint local_44;
  uintqueue *local_40;
  uintqueue *local_38;
  uintqueue *local_30;
  uintqueue *local_28;
  uintqueue *local_20;
  uintqueue *local_18;
  uintqueue *local_10;
  
  ppdVar3 = std::
            vector<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
            ::operator[](&this->Heads,(ulong)this->Top);
  this_00 = *ppdVar3;
  std::deque<unsigned_int,_std::allocator<unsigned_int>_>::end((iterator *)&qiter._M_node,this_00);
  std::deque<unsigned_int,_std::allocator<unsigned_int>_>::begin((iterator *)local_4c8,this_00);
  do {
    bVar1 = std::operator!=((_Self *)local_4c8,(_Self *)&qiter._M_node);
    if (!bVar1) {
      do {
        if ((this->T).pointer == 0) {
          return;
        }
        iVar7 = (this->T).pointer + -1;
        (this->T).pointer = iVar7;
        supgame_3._4_4_ = (this->T).queue[iVar7];
        local_390 = this;
        ppbVar5 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                            (&this->Supgame,(ulong)this->Top);
        entries_1 = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)*ppbVar5;
        pplVar6 = std::
                  vector<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
                  ::operator[](&this->Entries,(ulong)this->Top);
        curedge_3 = (int *)std::__cxx11::
                           list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ::begin(*pplVar6);
        local_3a8 = std::_List_iterator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
                    operator*((_List_iterator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)&curedge_3);
        for (register0x00000000 = (uint *)Solver::ins(&this->super_Solver,supgame_3._4_4_);
            *stack0xfffffffffffffc48 != 0xffffffff; register0x00000000 = stack0xfffffffffffffc48 + 1
            ) {
          local_3d0._20_4_ = *stack0xfffffffffffffc48;
          bitset::operator[]((bitset *)local_3d0,(size_t)&this->outgame);
          bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_3d0);
          if (!bVar1) {
            bitset::operator[]((bitset *)local_3e0,(size_t)entries_1);
            bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_3e0);
            if (bVar1) {
              local_3f8._20_4_ = local_3d0._20_4_;
              std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (local_3a8,(value_type_conflict4 *)(local_3f8 + 0x14));
            }
            else {
              uVar2 = Solver::owner(&this->super_Solver,local_3d0._20_4_);
              if (uVar2 == this->alpha) {
                bitset::operator[]((bitset *)local_3f8,(size_t)&this->R);
                bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_3f8);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  bitset::operator[]((bitset *)local_418,(size_t)&this->O);
                  bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_418);
                  if (bVar1) {
                    bitset::operator[]((bitset *)local_428,(size_t)&this->O);
                    bitset::reference::operator=((reference *)local_428,false);
                    this->strategy[(int)local_3d0._20_4_] = supgame_3._4_4_;
                  }
                }
                else {
                  bitset::operator[]((bitset *)local_408,(size_t)&this->R);
                  bitset::reference::operator=((reference *)local_408,true);
                  this->strategy[(int)local_3d0._20_4_] = supgame_3._4_4_;
                  local_370 = &this->T;
                  local_374 = local_3d0._20_4_;
                  iVar7 = (this->T).pointer;
                  (this->T).pointer = iVar7 + 1;
                  local_370->queue[iVar7] = local_3d0._20_4_;
                }
              }
              else {
                bitset::operator[]((bitset *)local_438,(size_t)&this->R);
                bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_438);
                if (((bVar1 ^ 0xffU) & 1) == 0) {
                  bitset::operator[]((bitset *)local_458,(size_t)&this->O);
                  bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_458);
                  if (bVar1) {
                    supgame_5._4_4_ = local_3d0._20_4_;
                    local_50 = this;
                    ppbVar5 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                        (&this->Supgame,(ulong)this->Top);
                    curedge_5 = (int *)*ppbVar5;
                    for (register0x00000000 =
                              (uint *)Solver::outs(&this->super_Solver,supgame_5._4_4_);
                        *stack0xffffffffffffff98 != 0xffffffff;
                        register0x00000000 = stack0xffffffffffffff98 + 1) {
                      local_80._20_4_ = *stack0xffffffffffffff98;
                      bitset::operator[]((bitset *)local_80,(size_t)&this->outgame);
                      bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_80);
                      local_519 = true;
                      if (!bVar1) {
                        bitset::operator[]((bitset *)local_90,(size_t)&this->R);
                        local_519 = bitset::reference::operator_cast_to_bool((reference *)local_90);
                      }
                      if (local_519 == false) {
                        bitset::operator[]((bitset *)&exits_3,(size_t)curedge_5);
                        bVar1 = bitset::reference::operator_cast_to_bool((reference *)&exits_3);
                        if (!bVar1) {
                          local_28 = &this->E;
                          (this->E).pointer = 0;
                          local_45 = '\0';
                          goto LAB_001ecbee;
                        }
                        local_40 = &this->E;
                        local_44 = local_80._20_4_;
                        iVar7 = (this->E).pointer;
                        (this->E).pointer = iVar7 + 1;
                        local_40->queue[iVar7] = local_80._20_4_;
                      }
                    }
                    ppbVar5 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                        (&this->Exits,(ulong)this->Pivot);
                    local_b8._16_8_ = *ppbVar5;
                    while (local_38 = &this->E, (this->E).pointer != 0) {
                      local_30 = &this->E;
                      (this->E).pointer = (this->E).pointer + -1;
                      bitset::operator[]((bitset *)local_b8,local_b8._16_8_);
                      bitset::reference::operator=((reference *)local_b8,true);
                    }
                    this->strategy[supgame_5._4_4_] = -1;
                    local_45 = '\x01';
LAB_001ecbee:
                    if (local_45 != '\0') {
                      bitset::operator[]((bitset *)local_468,(size_t)&this->O);
                      bitset::reference::operator=((reference *)local_468,false);
                    }
                  }
                }
                else {
                  supgame_4._4_4_ = local_3d0._20_4_;
                  local_e0 = this;
                  ppbVar5 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                      (&this->Supgame,(ulong)this->Top);
                  curedge_4 = (int *)*ppbVar5;
                  for (register0x00000000 =
                            (uint *)Solver::outs(&this->super_Solver,supgame_4._4_4_);
                      *stack0xffffffffffffff08 != 0xffffffff;
                      register0x00000000 = stack0xffffffffffffff08 + 1) {
                    local_110._20_4_ = *stack0xffffffffffffff08;
                    bitset::operator[]((bitset *)local_110,(size_t)&this->outgame);
                    bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_110);
                    local_509 = true;
                    if (!bVar1) {
                      bitset::operator[]((bitset *)local_120,(size_t)&this->R);
                      local_509 = bitset::reference::operator_cast_to_bool((reference *)local_120);
                    }
                    if (local_509 == false) {
                      bitset::operator[]((bitset *)&exits_2,(size_t)curedge_4);
                      bVar1 = bitset::reference::operator_cast_to_bool((reference *)&exits_2);
                      if (!bVar1) {
                        local_20 = &this->E;
                        (this->E).pointer = 0;
                        local_d5 = '\0';
                        goto LAB_001ec921;
                      }
                      local_d0 = &this->E;
                      local_d4 = local_110._20_4_;
                      iVar7 = (this->E).pointer;
                      (this->E).pointer = iVar7 + 1;
                      local_d0->queue[iVar7] = local_110._20_4_;
                    }
                  }
                  ppbVar5 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                      (&this->Exits,(ulong)this->Pivot);
                  local_148._16_8_ = *ppbVar5;
                  while (local_c8 = &this->E, (this->E).pointer != 0) {
                    local_c0 = &this->E;
                    (this->E).pointer = (this->E).pointer + -1;
                    bitset::operator[]((bitset *)local_148,local_148._16_8_);
                    bitset::reference::operator=((reference *)local_148,true);
                  }
                  this->strategy[supgame_4._4_4_] = -1;
                  local_d5 = '\x01';
LAB_001ec921:
                  if (local_d5 != '\0') {
                    bitset::operator[]((bitset *)local_448,(size_t)&this->R);
                    bitset::reference::operator=((reference *)local_448,true);
                    local_380 = &this->T;
                    local_384 = local_3d0._20_4_;
                    iVar7 = (this->T).pointer;
                    (this->T).pointer = iVar7 + 1;
                    local_380->queue[iVar7] = local_3d0._20_4_;
                  }
                }
              }
            }
          }
        }
      } while( true );
    }
    puVar4 = std::_Deque_iterator<unsigned_int,_unsigned_int_&,_unsigned_int_*>::operator*
                       ((_Deque_iterator<unsigned_int,_unsigned_int_&,_unsigned_int_*> *)local_4c8);
    supgame._4_4_ = *puVar4;
    local_290 = this;
    ppbVar5 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                        (&this->Supgame,(ulong)this->Top);
    entries = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)*ppbVar5;
    pplVar6 = std::
              vector<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
              ::operator[](&this->Entries,(ulong)this->Top);
    curedge = (int *)std::__cxx11::
                     list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ::begin(*pplVar6);
    local_2a8 = std::_List_iterator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>::
                operator*((_List_iterator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                           *)&curedge);
    for (register0x00000000 = (uint *)Solver::ins(&this->super_Solver,supgame._4_4_);
        *stack0xfffffffffffffd48 != 0xffffffff; register0x00000000 = stack0xfffffffffffffd48 + 1) {
      local_2d0._20_4_ = *stack0xfffffffffffffd48;
      bitset::operator[]((bitset *)local_2d0,(size_t)&this->outgame);
      bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_2d0);
      if (!bVar1) {
        bitset::operator[]((bitset *)local_2e0,(size_t)entries);
        bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_2e0);
        if (bVar1) {
          local_2f8._20_4_ = local_2d0._20_4_;
          std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (local_2a8,(value_type_conflict4 *)(local_2f8 + 0x14));
        }
        else {
          uVar2 = Solver::owner(&this->super_Solver,local_2d0._20_4_);
          if (uVar2 == this->alpha) {
            bitset::operator[]((bitset *)local_2f8,(size_t)&this->R);
            bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_2f8);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              bitset::operator[]((bitset *)local_318,(size_t)&this->O);
              bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_318);
              if (bVar1) {
                bitset::operator[]((bitset *)local_328,(size_t)&this->O);
                bitset::reference::operator=((reference *)local_328,false);
                this->strategy[(int)local_2d0._20_4_] = supgame._4_4_;
              }
            }
            else {
              bitset::operator[]((bitset *)local_308,(size_t)&this->R);
              bitset::reference::operator=((reference *)local_308,true);
              this->strategy[(int)local_2d0._20_4_] = supgame._4_4_;
              local_270 = &this->T;
              local_274 = local_2d0._20_4_;
              iVar7 = (this->T).pointer;
              (this->T).pointer = iVar7 + 1;
              local_270->queue[iVar7] = local_2d0._20_4_;
            }
          }
          else {
            bitset::operator[]((bitset *)local_338,(size_t)&this->R);
            bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_338);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              bitset::operator[]((bitset *)local_358,(size_t)&this->O);
              bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_358);
              if (bVar1) {
                supgame_2._4_4_ = local_2d0._20_4_;
                local_170 = this;
                ppbVar5 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                    (&this->Supgame,(ulong)this->Top);
                curedge_2 = (int *)*ppbVar5;
                for (register0x00000000 = (uint *)Solver::outs(&this->super_Solver,supgame_2._4_4_);
                    *stack0xfffffffffffffe78 != 0xffffffff;
                    register0x00000000 = stack0xfffffffffffffe78 + 1) {
                  local_1a0._20_4_ = *stack0xfffffffffffffe78;
                  bitset::operator[]((bitset *)local_1a0,(size_t)&this->outgame);
                  bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_1a0);
                  local_4f1 = true;
                  if (!bVar1) {
                    bitset::operator[]((bitset *)local_1b0,(size_t)&this->R);
                    local_4f1 = bitset::reference::operator_cast_to_bool((reference *)local_1b0);
                  }
                  if (local_4f1 == false) {
                    bitset::operator[]((bitset *)&exits_1,(size_t)curedge_2);
                    bVar1 = bitset::reference::operator_cast_to_bool((reference *)&exits_1);
                    if (!bVar1) {
                      local_18 = &this->E;
                      (this->E).pointer = 0;
                      local_165 = '\0';
                      goto LAB_001ec315;
                    }
                    local_160 = &this->E;
                    local_164 = local_1a0._20_4_;
                    iVar7 = (this->E).pointer;
                    (this->E).pointer = iVar7 + 1;
                    local_160->queue[iVar7] = local_1a0._20_4_;
                  }
                }
                ppbVar5 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                    (&this->Exits,(ulong)this->Pivot);
                local_1d8._16_8_ = *ppbVar5;
                while (local_158 = &this->E, (this->E).pointer != 0) {
                  local_150 = &this->E;
                  (this->E).pointer = (this->E).pointer + -1;
                  bitset::operator[]((bitset *)local_1d8,local_1d8._16_8_);
                  bitset::reference::operator=((reference *)local_1d8,true);
                }
                this->strategy[supgame_2._4_4_] = -1;
                local_165 = '\x01';
LAB_001ec315:
                if (local_165 != '\0') {
                  bitset::operator[]((bitset *)local_368,(size_t)&this->O);
                  bitset::reference::operator=((reference *)local_368,false);
                }
              }
            }
            else {
              supgame_1._4_4_ = local_2d0._20_4_;
              local_200 = this;
              ppbVar5 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                  (&this->Supgame,(ulong)this->Top);
              curedge_1 = (int *)*ppbVar5;
              for (register0x00000000 = (uint *)Solver::outs(&this->super_Solver,supgame_1._4_4_);
                  *stack0xfffffffffffffde8 != 0xffffffff;
                  register0x00000000 = stack0xfffffffffffffde8 + 1) {
                local_230._20_4_ = *stack0xfffffffffffffde8;
                bitset::operator[]((bitset *)local_230,(size_t)&this->outgame);
                bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_230);
                local_4e1 = true;
                if (!bVar1) {
                  bitset::operator[]((bitset *)local_240,(size_t)&this->R);
                  local_4e1 = bitset::reference::operator_cast_to_bool((reference *)local_240);
                }
                if (local_4e1 == false) {
                  bitset::operator[]((bitset *)&exits,(size_t)curedge_1);
                  bVar1 = bitset::reference::operator_cast_to_bool((reference *)&exits);
                  if (!bVar1) {
                    local_10 = &this->E;
                    (this->E).pointer = 0;
                    local_1f5 = '\0';
                    goto LAB_001ebff1;
                  }
                  local_1f0 = &this->E;
                  local_1f4 = local_230._20_4_;
                  iVar7 = (this->E).pointer;
                  (this->E).pointer = iVar7 + 1;
                  local_1f0->queue[iVar7] = local_230._20_4_;
                }
              }
              ppbVar5 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[]
                                  (&this->Exits,(ulong)this->Pivot);
              local_268._16_8_ = *ppbVar5;
              while (local_1e8 = &this->E, (this->E).pointer != 0) {
                local_1e0 = &this->E;
                (this->E).pointer = (this->E).pointer + -1;
                bitset::operator[]((bitset *)local_268,local_268._16_8_);
                bitset::reference::operator=((reference *)local_268,true);
              }
              this->strategy[supgame_1._4_4_] = -1;
              local_1f5 = '\x01';
LAB_001ebff1:
              if (local_1f5 != '\0') {
                bitset::operator[]((bitset *)local_348,(size_t)&this->R);
                bitset::reference::operator=((reference *)local_348,true);
                local_280 = &this->T;
                local_284 = local_2d0._20_4_;
                iVar7 = (this->T).pointer;
                (this->T).pointer = iVar7 + 1;
                local_280->queue[iVar7] = local_2d0._20_4_;
              }
            }
          }
        }
      }
    }
    std::_Deque_iterator<unsigned_int,_unsigned_int_&,_unsigned_int_*>::operator++
              ((_Deque_iterator<unsigned_int,_unsigned_int_&,_unsigned_int_*> *)local_4c8);
  } while( true );
}

Assistant:

void NPPSolver::atronsubgamedw()
{
    auto & heads = *(Heads[Top]);
    auto qend = heads.end();
    for (auto qiter = heads.begin(); qiter != qend; ++qiter)
    {
        pushinqueueonsubgamedw(*qiter);
    }
    while (T.nonempty())
    {
        pushinqueueonsubgamedw(T.pop());
    }
}